

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::scatterv_big<int>
               (int *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,int *out,
               size_t recv_size,int root,comm *comm)

{
  unsigned_long uVar1;
  MPI_Comm poVar2;
  ulong uVar3;
  MPI_Datatype poVar4;
  MPI_Request *ppoVar5;
  datatype *__stat_loc;
  ulong uVar6;
  long lVar7;
  datatype dt_1;
  datatype dt;
  requests reqs;
  
  uVar3 = (ulong)(uint)root;
  reqs._vptr_requests = (_func_int **)&PTR__requests_00166340;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (comm->m_rank == root) {
    lVar7 = 0;
    __stat_loc = (datatype *)sizes;
    for (uVar6 = 0; (long)uVar6 < (long)comm->m_size; uVar6 = uVar6 + 1) {
      dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00166310;
      dt_1.mpitype = (MPI_Datatype)&ompi_mpi_int;
      dt_1.builtin = true;
      __stat_loc = &dt_1;
      datatype::contiguous
                (&dt,&dt_1,
                 (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar6]);
      datatype::~datatype(&dt_1);
      poVar4 = dt.mpitype;
      if (uVar3 == uVar6) {
        uVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        if (uVar1 != 0) {
          __stat_loc = (datatype *)(msgs + lVar7);
          memmove(out,__stat_loc,uVar1 << 2);
        }
      }
      else {
        poVar2 = comm->mpi_comm;
        ppoVar5 = requests::add(&reqs);
        __stat_loc = (datatype *)0x1;
        MPI_Isend(msgs + lVar7,1,poVar4,uVar6 & 0xffffffff,0x4d2,poVar2,ppoVar5);
      }
      lVar7 = lVar7 + (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar6];
      datatype::~datatype(&dt);
    }
  }
  else {
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00166310;
    dt_1.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt_1.builtin = true;
    datatype::contiguous(&dt,&dt_1,recv_size);
    datatype::~datatype(&dt_1);
    poVar2 = comm->mpi_comm;
    ppoVar5 = requests::add(&reqs);
    __stat_loc = (datatype *)0x1;
    MPI_Irecv(out,1,dt.mpitype,uVar3,0x4d2,poVar2,ppoVar5);
    datatype::~datatype(&dt);
  }
  requests::wait(&reqs,__stat_loc);
  requests::~requests(&reqs);
  return;
}

Assistant:

void scatterv_big(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        std::size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(msgs+offset, msgs+offset+sizes[i], out);
            } else {
                MPI_Isend(const_cast<T*>(msgs)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_size);
        MPI_Irecv(const_cast<T*>(out), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}